

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O1

bool flow::lang::TokenTraits::isType(Token t)

{
  return (t & ~String) == VoidType;
}

Assistant:

bool TokenTraits::isType(Token t) {
  switch (t) {
    case Token::VoidType:
    case Token::BoolType:
    case Token::NumberType:
    case Token::StringType:
      return true;
    default:
      return false;
  }
}